

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpool.h
# Opt level: O1

void __thiscall CVmPoolPaged::~CVmPoolPaged(CVmPoolPaged *this)

{
  *(undefined ***)this = &PTR__CVmPoolPaged_0032d518;
  if (this->pages_ != (CVmPool_pg *)0x0) {
    free(this->pages_);
    this->pages_ = (CVmPool_pg *)0x0;
    this->page_slots_ = 0;
    this->page_slots_max_ = 0;
  }
  *(undefined8 *)&this->field_0x10 = 0;
  operator_delete(this,0x38);
  return;
}

Assistant:

virtual ~CVmPoolPaged() { terminate_nv(); }